

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O0

void __thiscall
testing::
Action<ot::commissioner::Error_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>::
Action(Action<ot::commissioner::Error_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>
       *this,ActionInterface<ot::commissioner::Error_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>
             *impl)

{
  ActionAdapter local_28;
  ActionInterface<ot::commissioner::Error_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>
  *local_18;
  ActionInterface<ot::commissioner::Error_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>
  *impl_local;
  Action<ot::commissioner::Error_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>
  *this_local;
  
  local_18 = impl;
  impl_local = (ActionInterface<ot::commissioner::Error_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>
                *)this;
  std::
  shared_ptr<testing::ActionInterface<ot::commissioner::Error(ot::commissioner::ActiveOperationalDataset&,unsigned_short)>>
  ::
  shared_ptr<testing::ActionInterface<ot::commissioner::Error(ot::commissioner::ActiveOperationalDataset&,unsigned_short)>,void>
            ((shared_ptr<testing::ActionInterface<ot::commissioner::Error(ot::commissioner::ActiveOperationalDataset&,unsigned_short)>>
              *)&local_28,impl);
  std::function<ot::commissioner::Error(ot::commissioner::ActiveOperationalDataset&,unsigned_short)>
  ::
  function<testing::Action<ot::commissioner::Error(ot::commissioner::ActiveOperationalDataset&,unsigned_short)>::ActionAdapter,void>
            ((function<ot::commissioner::Error(ot::commissioner::ActiveOperationalDataset&,unsigned_short)>
              *)this,&local_28);
  ActionAdapter::~ActionAdapter(&local_28);
  return;
}

Assistant:

explicit Action(ActionInterface<F>* impl)
      : fun_(ActionAdapter{::std::shared_ptr<ActionInterface<F>>(impl)}) {}